

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# resolve_links.cpp
# Opt level: O0

void __thiscall
libtorrent::aux::resolve_links::match_v2
          (resolve_links *this,shared_ptr<const_libtorrent::torrent_info> *ti,string *save_path)

{
  strong_typedef<int,_libtorrent::aux::file_index_tag,_void> idx_00;
  bool bVar1;
  index_iter<libtorrent::aux::strong_typedef<int,_libtorrent::aux::file_index_tag,_void>_> rhs;
  element_type *this_00;
  file_storage *this_01;
  pointer ppVar2;
  value_type *pvVar3;
  _Node_iterator_base<std::pair<const_libtorrent::digest32<256L>,_libtorrent::aux::strong_typedef<int,_libtorrent::aux::file_index_tag,_void>_>,_true>
  _Stack_88;
  strong_typedef<int,_libtorrent::aux::file_index_tag,_void> idx;
  sha256_hash local_78;
  _Node_iterator_base<std::pair<const_libtorrent::digest32<256L>,_libtorrent::aux::strong_typedef<int,_libtorrent::aux::file_index_tag,_void>_>,_true>
  local_58;
  iterator iter;
  strong_typedef<int,_libtorrent::aux::file_index_tag,_void> i;
  index_iter<libtorrent::aux::strong_typedef<int,_libtorrent::aux::file_index_tag,_void>_> local_3c;
  index_iter<libtorrent::aux::strong_typedef<int,_libtorrent::aux::file_index_tag,_void>_> __end2;
  index_iter<libtorrent::aux::strong_typedef<int,_libtorrent::aux::file_index_tag,_void>_> __begin2;
  index_range<libtorrent::aux::strong_typedef<int,_libtorrent::aux::file_index_tag,_void>_>
  *__range2;
  file_storage *fs;
  string *save_path_local;
  shared_ptr<const_libtorrent::torrent_info> *ti_local;
  resolve_links *this_local;
  
  this_00 = ::std::
            __shared_ptr_access<const_libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2,_false,_false>
            ::operator->((__shared_ptr_access<const_libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)ti);
  this_01 = torrent_info::files(this_00);
  ___end2 = file_storage::file_range(this_01);
  local_3c = index_range<libtorrent::aux::strong_typedef<int,_libtorrent::aux::file_index_tag,_void>_>
             ::begin((index_range<libtorrent::aux::strong_typedef<int,_libtorrent::aux::file_index_tag,_void>_>
                      *)&__end2);
  rhs = index_range<libtorrent::aux::strong_typedef<int,_libtorrent::aux::file_index_tag,_void>_>::
        end((index_range<libtorrent::aux::strong_typedef<int,_libtorrent::aux::file_index_tag,_void>_>
             *)&__end2);
  while (bVar1 = libtorrent::operator!=(local_3c,rhs), bVar1) {
    iter.
    super__Node_iterator_base<std::pair<const_libtorrent::digest32<256L>,_libtorrent::aux::strong_typedef<int,_libtorrent::aux::file_index_tag,_void>_>,_true>
    ._M_cur._0_4_ =
         index_iter<libtorrent::aux::strong_typedef<int,_libtorrent::aux::file_index_tag,_void>_>::
         operator*(&local_3c);
    iter.
    super__Node_iterator_base<std::pair<const_libtorrent::digest32<256L>,_libtorrent::aux::strong_typedef<int,_libtorrent::aux::file_index_tag,_void>_>,_true>
    ._M_cur._4_4_ =
         iter.
         super__Node_iterator_base<std::pair<const_libtorrent::digest32<256L>,_libtorrent::aux::strong_typedef<int,_libtorrent::aux::file_index_tag,_void>_>,_true>
         ._M_cur._0_4_;
    bVar1 = file_storage::pad_file_at
                      (this_01,(file_index_t)
                               iter.
                               super__Node_iterator_base<std::pair<const_libtorrent::digest32<256L>,_libtorrent::aux::strong_typedef<int,_libtorrent::aux::file_index_tag,_void>_>,_true>
                               ._M_cur._0_4_);
    if (!bVar1) {
      file_storage::root(&local_78,this_01,
                         (file_index_t)
                         iter.
                         super__Node_iterator_base<std::pair<const_libtorrent::digest32<256L>,_libtorrent::aux::strong_typedef<int,_libtorrent::aux::file_index_tag,_void>_>,_true>
                         ._M_cur._4_4_);
      local_58._M_cur =
           (__node_type *)
           ::std::
           unordered_multimap<libtorrent::digest32<256L>,_libtorrent::aux::strong_typedef<int,_libtorrent::aux::file_index_tag,_void>,_std::hash<libtorrent::digest32<256L>_>,_std::equal_to<libtorrent::digest32<256L>_>,_std::allocator<std::pair<const_libtorrent::digest32<256L>,_libtorrent::aux::strong_typedef<int,_libtorrent::aux::file_index_tag,_void>_>_>_>
           ::find(&this->m_file_roots,&local_78);
      _Stack_88._M_cur =
           (__node_type *)
           ::std::
           unordered_multimap<libtorrent::digest32<256L>,_libtorrent::aux::strong_typedef<int,_libtorrent::aux::file_index_tag,_void>,_std::hash<libtorrent::digest32<256L>_>,_std::equal_to<libtorrent::digest32<256L>_>,_std::allocator<std::pair<const_libtorrent::digest32<256L>,_libtorrent::aux::strong_typedef<int,_libtorrent::aux::file_index_tag,_void>_>_>_>
           ::end(&this->m_file_roots);
      bVar1 = ::std::__detail::operator==(&local_58,&stack0xffffffffffffff78);
      if (!bVar1) {
        ppVar2 = ::std::__detail::
                 _Node_iterator<std::pair<const_libtorrent::digest32<256L>,_libtorrent::aux::strong_typedef<int,_libtorrent::aux::file_index_tag,_void>_>,_false,_true>
                 ::operator->((_Node_iterator<std::pair<const_libtorrent::digest32<256L>,_libtorrent::aux::strong_typedef<int,_libtorrent::aux::file_index_tag,_void>_>,_false,_true>
                               *)&local_58);
        idx_00.m_val = (ppVar2->second).m_val;
        pvVar3 = container_wrapper<libtorrent::aux::resolve_links::link_t,_libtorrent::aux::strong_typedef<int,_libtorrent::aux::file_index_tag,_void>,_std::vector<libtorrent::aux::resolve_links::link_t,_std::allocator<libtorrent::aux::resolve_links::link_t>_>_>
                 ::operator[](&this->m_links,idx_00);
        bVar1 = ::std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)pvVar3);
        if (!bVar1) {
          pvVar3 = container_wrapper<libtorrent::aux::resolve_links::link_t,_libtorrent::aux::strong_typedef<int,_libtorrent::aux::file_index_tag,_void>,_std::vector<libtorrent::aux::resolve_links::link_t,_std::allocator<libtorrent::aux::resolve_links::link_t>_>_>
                   ::operator[](&this->m_links,idx_00);
          ::std::shared_ptr<const_libtorrent::torrent_info>::operator=(&pvVar3->ti,ti);
          pvVar3 = container_wrapper<libtorrent::aux::resolve_links::link_t,_libtorrent::aux::strong_typedef<int,_libtorrent::aux::file_index_tag,_void>,_std::vector<libtorrent::aux::resolve_links::link_t,_std::allocator<libtorrent::aux::resolve_links::link_t>_>_>
                   ::operator[](&this->m_links,idx_00);
          ::std::__cxx11::string::operator=((string *)&pvVar3->save_path,(string *)save_path);
          pvVar3 = container_wrapper<libtorrent::aux::resolve_links::link_t,_libtorrent::aux::strong_typedef<int,_libtorrent::aux::file_index_tag,_void>,_std::vector<libtorrent::aux::resolve_links::link_t,_std::allocator<libtorrent::aux::resolve_links::link_t>_>_>
                   ::operator[](&this->m_links,idx_00);
          (pvVar3->file_idx).m_val =
               iter.
               super__Node_iterator_base<std::pair<const_libtorrent::digest32<256L>,_libtorrent::aux::strong_typedef<int,_libtorrent::aux::file_index_tag,_void>_>,_true>
               ._M_cur._4_4_;
          ::std::
          unordered_multimap<libtorrent::digest32<256L>,_libtorrent::aux::strong_typedef<int,_libtorrent::aux::file_index_tag,_void>,_std::hash<libtorrent::digest32<256L>_>,_std::equal_to<libtorrent::digest32<256L>_>,_std::allocator<std::pair<const_libtorrent::digest32<256L>,_libtorrent::aux::strong_typedef<int,_libtorrent::aux::file_index_tag,_void>_>_>_>
          ::erase(&this->m_file_roots,(iterator)local_58._M_cur);
        }
      }
    }
    index_iter<libtorrent::aux::strong_typedef<int,_libtorrent::aux::file_index_tag,_void>_>::
    operator++(&local_3c);
  }
  return;
}

Assistant:

void resolve_links::match_v2(std::shared_ptr<torrent_info const> const& ti
	, std::string const& save_path)
{
	file_storage const& fs = ti->files();
	for (auto const i : fs.file_range())
	{
		// for every file in the other torrent, see if we have one that match
		// it in m_torrent_file
		if (fs.pad_file_at(i)) continue;

		auto const iter = m_file_roots.find(fs.root(i));
		if (iter == m_file_roots.end()) continue;

		auto const idx = iter->second;

		TORRENT_ASSERT(idx >= file_index_t(0));
		TORRENT_ASSERT(idx < m_torrent_file->files().end_file());

		// if we already have found a duplicate for this file, no need
		// to keep looking
		if (m_links[idx].ti) continue;

		m_links[idx].ti = ti;
		m_links[idx].save_path = save_path;
		m_links[idx].file_idx = i;

		// since we have a duplicate for this file, we may as well remove
		// it from the file-size map, so we won't find it again.
		m_file_roots.erase(iter);
	}
}